

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-writer.cc
# Opt level: O3

void wabt::WriteOpcode(Stream *stream,Opcode opcode)

{
  Opcode local_6c;
  Info local_68;
  
  local_6c.enum_ = opcode.enum_;
  Opcode::GetInfo(&local_68,&local_6c);
  if (local_68.prefix == 0) {
    Opcode::GetInfo(&local_68,&local_6c);
    Opcode::GetInfo(&local_68,&local_6c);
    Stream::WriteU8(stream,local_68.code,local_68.name,No);
  }
  else {
    Opcode::GetInfo(&local_68,&local_6c);
    Stream::WriteU8(stream,(uint)local_68.prefix,"prefix",No);
    Opcode::GetInfo(&local_68,&local_6c);
    Opcode::GetInfo(&local_68,&local_6c);
    WriteU32Leb128(stream,local_68.code,local_68.name);
  }
  return;
}

Assistant:

void WriteOpcode(Stream* stream, Opcode opcode) {
  if (opcode.HasPrefix()) {
    stream->WriteU8(opcode.GetPrefix(), "prefix");
    WriteU32Leb128(stream, opcode.GetCode(), opcode.GetName());
  } else {
    stream->WriteU8(opcode.GetCode(), opcode.GetName());
  }
}